

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subdiv.c
# Opt level: O0

REF_STATUS ref_subdiv_split(REF_SUBDIV ref_subdiv)

{
  uint uVar1;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  int local_98;
  int local_94;
  REF_STATUS ref_private_macro_code_rss_23;
  REF_STATUS ref_private_macro_code_rss_22;
  REF_STATUS ref_private_macro_code_rss_21;
  REF_STATUS ref_private_macro_code_rss_20;
  REF_STATUS ref_private_macro_code_rss_19;
  REF_STATUS ref_private_macro_code_rss_18;
  REF_STATUS ref_private_macro_code_rss_17;
  REF_STATUS ref_private_macro_code_rss_16;
  REF_STATUS ref_private_macro_code_rss_15;
  REF_STATUS ref_private_macro_code_rss_14;
  REF_STATUS ref_private_macro_code_rss_13;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT nmark;
  REF_INT node;
  REF_NODE ref_node;
  REF_GRID ref_grid;
  REF_SUBDIV ref_subdiv_local;
  
  ref_node = (REF_NODE)ref_subdiv->grid;
  _nmark = ref_subdiv->grid->node;
  ref_grid = (REF_GRID)ref_subdiv;
  uVar1 = ref_node_synchronize_globals(_nmark);
  if (uVar1 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",0x861,
           "ref_subdiv_split",(ulong)uVar1,"sync glob for mark relax");
    return uVar1;
  }
  if (*(int *)(ref_grid->cell + 3) != 0) {
    uVar1 = ref_subdiv_mark_n((REF_SUBDIV)ref_grid,&ref_private_macro_code_rss_1);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
             0x864,"ref_subdiv_split",(ulong)uVar1,"count");
      return uVar1;
    }
    if (*(int *)(*(long *)ref_grid->mpi + 4) == 0) {
      printf(" %d edges marked before relaxation\n",(ulong)(uint)ref_private_macro_code_rss_1);
    }
  }
  if (*(int *)(ref_grid->cell + 2) == 0) {
    uVar1 = ref_subdiv_unmark_geom_support((REF_SUBDIV)ref_grid);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
             0x873,"ref_subdiv_split",(ulong)uVar1,"all geom marks");
      return uVar1;
    }
    if ((*(int *)((long)ref_grid->cell + 0x14) != 0) &&
       (uVar1 = ref_subdiv_mark_relax((REF_SUBDIV)ref_grid), uVar1 != 0)) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
             0x875,"ref_subdiv_split",(ulong)uVar1,"relax marks");
      return uVar1;
    }
    uVar1 = ref_subdiv_unmark_geom_support((REF_SUBDIV)ref_grid);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
             0x877,"ref_subdiv_split",(ulong)uVar1,"all geom marks");
      return uVar1;
    }
    uVar1 = ref_subdiv_unmark_relax((REF_SUBDIV)ref_grid);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
             0x878,"ref_subdiv_split",(ulong)uVar1,"relax marks");
      return uVar1;
    }
    uVar1 = ref_subdiv_test_impossible_marks((REF_SUBDIV)ref_grid);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
             0x879,"ref_subdiv_split",(ulong)uVar1,"possible");
      return uVar1;
    }
    uVar1 = ref_subdiv_new_node((REF_SUBDIV)ref_grid);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
             0x87a,"ref_subdiv_split",(ulong)uVar1,"new nodes");
      return uVar1;
    }
  }
  else {
    if (*(int *)((long)ref_grid->cell + 0x14) != 0) {
      uVar1 = ref_subdiv_mark_relax((REF_SUBDIV)ref_grid);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
               0x86b,"ref_subdiv_split",(ulong)uVar1,"relax marks");
        return uVar1;
      }
      uVar1 = ref_subdiv_test_impossible_marks((REF_SUBDIV)ref_grid);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
               0x86c,"ref_subdiv_split",(ulong)uVar1,"possible");
        return uVar1;
      }
    }
    uVar1 = ref_subdiv_new_node((REF_SUBDIV)ref_grid);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
             0x86e,"ref_subdiv_split",(ulong)uVar1,"new nodes");
      return uVar1;
    }
    uVar1 = ref_subdiv_unmark_neg_tet_relax((REF_SUBDIV)ref_grid);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
             0x86f,"ref_subdiv_split",(ulong)uVar1,"geom neg marks");
      return uVar1;
    }
    uVar1 = ref_subdiv_test_impossible_marks((REF_SUBDIV)ref_grid);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
             0x870,"ref_subdiv_split",(ulong)uVar1,"possible");
      return uVar1;
    }
    uVar1 = ref_subdiv_new_node((REF_SUBDIV)ref_grid);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
             0x871,"ref_subdiv_split",(ulong)uVar1,"new nodes");
      return uVar1;
    }
  }
  uVar1 = ref_subdiv_split_tet((REF_SUBDIV)ref_grid);
  if (uVar1 == 0) {
    uVar1 = ref_subdiv_split_pri((REF_SUBDIV)ref_grid);
    if (uVar1 == 0) {
      uVar1 = ref_subdiv_split_pyr((REF_SUBDIV)ref_grid);
      if (uVar1 == 0) {
        uVar1 = ref_subdiv_split_qua((REF_SUBDIV)ref_grid);
        if (uVar1 == 0) {
          uVar1 = ref_subdiv_split_tri((REF_SUBDIV)ref_grid);
          if (uVar1 == 0) {
            uVar1 = ref_subdiv_split_edg((REF_SUBDIV)ref_grid);
            if (uVar1 == 0) {
              for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < _nmark->max;
                  ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
                if (((-1 < ref_private_macro_code_rss) && (ref_private_macro_code_rss < _nmark->max)
                    ) && (-1 < _nmark->global[ref_private_macro_code_rss])) {
                  if ((ref_private_macro_code_rss < 0) ||
                     (**(int **)&ref_node->ref_mpi[1].max_tag <= ref_private_macro_code_rss)) {
                    local_94 = -1;
                  }
                  else {
                    local_94 = *(int *)(*(long *)(*(long *)&ref_node->ref_mpi[1].max_tag + 8) +
                                       (long)ref_private_macro_code_rss * 4);
                  }
                  if (local_94 == -1) {
                    if ((ref_private_macro_code_rss < 0) ||
                       (**(int **)(*(long *)&ref_node->n_unused + 0x40) <=
                        ref_private_macro_code_rss)) {
                      local_98 = -1;
                    }
                    else {
                      local_98 = *(int *)(*(long *)(*(long *)(*(long *)&ref_node->n_unused + 0x40) +
                                                   8) + (long)ref_private_macro_code_rss * 4);
                    }
                    if (local_98 == -1) {
                      if ((ref_private_macro_code_rss < 0) ||
                         (*(int *)ref_node->unused_global[8] <= ref_private_macro_code_rss)) {
                        local_9c = -1;
                      }
                      else {
                        local_9c = *(int *)(*(long *)(ref_node->unused_global[8] + 8) +
                                           (long)ref_private_macro_code_rss * 4);
                      }
                      if (local_9c == -1) {
                        if ((ref_private_macro_code_rss < 0) ||
                           (**(int **)(ref_node->old_n_global + 0x40) <= ref_private_macro_code_rss)
                           ) {
                          local_a0 = -1;
                        }
                        else {
                          local_a0 = *(int *)(*(long *)(*(long *)(ref_node->old_n_global + 0x40) + 8
                                                       ) + (long)ref_private_macro_code_rss * 4);
                        }
                        if (local_a0 == -1) {
                          if (*(int *)(*(long *)ref_grid->mpi + 4) ==
                              _nmark->part[ref_private_macro_code_rss]) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                                   ,0x890,"ref_subdiv_split",1,"unused local node");
                            return 1;
                          }
                          if ((ref_private_macro_code_rss < 0) ||
                             (**(int **)(ref_node->part + 0x10) <= ref_private_macro_code_rss)) {
                            local_a4 = -1;
                          }
                          else {
                            local_a4 = *(int *)(*(long *)(*(long *)(ref_node->part + 0x10) + 8) +
                                               (long)ref_private_macro_code_rss * 4);
                          }
                          if (local_a4 != -1) {
code_r0x002e4387:
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                                   ,0x894,"ref_subdiv_split",1,"boundary face node not in vol cells"
                                  );
                            return 1;
                          }
                          if ((ref_private_macro_code_rss < 0) ||
                             (**(int **)(*(long *)&ref_node->naux + 0x40) <=
                              ref_private_macro_code_rss)) {
                            local_a8 = -1;
                          }
                          else {
                            local_a8 = *(int *)(*(long *)(*(long *)(*(long *)&ref_node->naux + 0x40)
                                                         + 8) + (long)ref_private_macro_code_rss * 4
                                               );
                          }
                          if (local_a8 != -1) goto code_r0x002e4387;
                          uVar1 = ref_node_remove_without_global(_nmark,ref_private_macro_code_rss);
                          if (uVar1 != 0) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                                   ,0x896,"ref_subdiv_split",(ulong)uVar1,"rm");
                            return uVar1;
                          }
                          uVar1 = ref_geom_remove_all(*(REF_GEOM *)&ref_node->ratio_method,
                                                      ref_private_macro_code_rss);
                          if (uVar1 != 0) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                                   ,0x897,"ref_subdiv_split",(ulong)uVar1,"rm");
                            return uVar1;
                          }
                        }
                      }
                    }
                  }
                }
              }
              ref_subdiv_local._4_4_ = 0;
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                     ,0x886,"ref_subdiv_split",(ulong)uVar1,"split edg");
              ref_subdiv_local._4_4_ = uVar1;
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                   ,0x884,"ref_subdiv_split",(ulong)uVar1,"split tri");
            ref_subdiv_local._4_4_ = uVar1;
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
                 0x882,"ref_subdiv_split",(ulong)uVar1,"split qua");
          ref_subdiv_local._4_4_ = uVar1;
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
               0x880,"ref_subdiv_split",(ulong)uVar1,"split pyr");
        ref_subdiv_local._4_4_ = uVar1;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
             0x87e,"ref_subdiv_split",(ulong)uVar1,"split pri");
      ref_subdiv_local._4_4_ = uVar1;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",0x87d,
           "ref_subdiv_split",(ulong)uVar1,"split tet");
    ref_subdiv_local._4_4_ = uVar1;
  }
  return ref_subdiv_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_subdiv_split(REF_SUBDIV ref_subdiv) {
  REF_GRID ref_grid = ref_subdiv_grid(ref_subdiv);
  REF_NODE ref_node = ref_grid_node(ref_subdiv_grid(ref_subdiv));
  REF_INT node;
  REF_INT nmark;

  RSS(ref_node_synchronize_globals(ref_node), "sync glob for mark relax");

  if (ref_subdiv->instrument) {
    RSS(ref_subdiv_mark_n(ref_subdiv, &nmark), "count");
    if (ref_mpi_once(ref_subdiv_mpi(ref_subdiv)))
      printf(" %d edges marked before relaxation\n", nmark);
  }

  if (ref_subdiv->allow_geometry) {
    if (ref_subdiv_new_mark_allowed(ref_subdiv)) {
      RSS(ref_subdiv_mark_relax(ref_subdiv), "relax marks");
      RSS(ref_subdiv_test_impossible_marks(ref_subdiv), "possible");
    }
    RSS(ref_subdiv_new_node(ref_subdiv), "new nodes");
    RSS(ref_subdiv_unmark_neg_tet_relax(ref_subdiv), "geom neg marks");
    RSS(ref_subdiv_test_impossible_marks(ref_subdiv), "possible");
    RSS(ref_subdiv_new_node(ref_subdiv), "new nodes");
  } else {
    RSS(ref_subdiv_unmark_geom_support(ref_subdiv), "all geom marks");
    if (ref_subdiv_new_mark_allowed(ref_subdiv)) {
      RSS(ref_subdiv_mark_relax(ref_subdiv), "relax marks");
    }
    RSS(ref_subdiv_unmark_geom_support(ref_subdiv), "all geom marks");
    RSS(ref_subdiv_unmark_relax(ref_subdiv), "relax marks");
    RSS(ref_subdiv_test_impossible_marks(ref_subdiv), "possible");
    RSS(ref_subdiv_new_node(ref_subdiv), "new nodes");
  }

  RSS(ref_subdiv_split_tet(ref_subdiv), "split tet");
  RSS(ref_subdiv_split_pri(ref_subdiv), "split pri");
  /* pyr comes last, it can make other elements too */
  RSS(ref_subdiv_split_pyr(ref_subdiv), "split pyr");

  RSS(ref_subdiv_split_qua(ref_subdiv), "split qua");
  /* tri comes last, it can make qua elements too */
  RSS(ref_subdiv_split_tri(ref_subdiv), "split tri");

  RSS(ref_subdiv_split_edg(ref_subdiv), "split edg");

  /* remove unused nodes on partition boundaries */
  each_ref_node_valid_node(ref_node, node) {
    if (ref_adj_empty(ref_cell_adj(ref_grid_tet(ref_grid)), node) &&
        ref_adj_empty(ref_cell_adj(ref_grid_pyr(ref_grid)), node) &&
        ref_adj_empty(ref_cell_adj(ref_grid_pri(ref_grid)), node) &&
        ref_adj_empty(ref_cell_adj(ref_grid_hex(ref_grid)), node)) {
      if (ref_mpi_rank(ref_subdiv_mpi(ref_subdiv)) ==
          ref_node_part(ref_node, node)) {
        RSS(REF_FAILURE, "unused local node");
      }
      if (!ref_adj_empty(ref_cell_adj(ref_grid_tri(ref_grid)), node) ||
          !ref_adj_empty(ref_cell_adj(ref_grid_qua(ref_grid)), node)) {
        RSS(REF_FAILURE, "boundary face node not in vol cells");
      }
      RSS(ref_node_remove_without_global(ref_node, node), "rm");
      RSS(ref_geom_remove_all(ref_grid_geom(ref_grid), node), "rm");
    }
  }

  return REF_SUCCESS;
}